

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS
ref_collapse_edge_same_normal(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  int iVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  REF_INT cell;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL supported;
  REF_DBL n1 [3];
  REF_DBL n0 [3];
  REF_INT nodes [27];
  int local_fc;
  REF_BOOL *local_f8;
  REF_GEOM local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_c8;
  double local_c0;
  double local_b8;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  local_f0 = ref_grid->geom;
  *allowed = 1;
  uVar6 = 0xffffffff;
  if (-1 < node1) {
    uVar6 = 0xffffffff;
    if (node1 < ref_cell->ref_adj->nnode) {
      uVar6 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node1];
    }
  }
  if ((int)uVar6 != -1) {
    cell = ref_cell->ref_adj->item[(int)uVar6].ref;
    local_f8 = allowed;
    do {
      pRVar2 = ref_cell->c2n;
      lVar5 = (long)cell * (long)ref_cell->size_per;
      if (((pRVar2[lVar5] != node0) && (pRVar2[lVar5 + 1] != node0)) && (pRVar2[lVar5 + 2] != node0)
         ) {
        uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x298,"ref_collapse_edge_same_normal",(ulong)uVar4,"nodes");
          return uVar4;
        }
        uVar4 = ref_geom_tri_supported(local_f0,local_a8,&local_fc);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x29a,"ref_collapse_edge_same_normal",(ulong)uVar4,"tri support");
          return uVar4;
        }
        if (local_fc == 0) {
          uVar4 = ref_node_tri_normal(ref_node,local_a8,&local_c8);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x29d,"ref_collapse_edge_same_normal",(ulong)uVar4,"orig normal");
            return uVar4;
          }
          uVar4 = ref_math_normalize(&local_c8);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x29e,"ref_collapse_edge_same_normal",(ulong)uVar4,
                   "original triangle has zero area");
            return uVar4;
          }
          if (0 < ref_cell->node_per) {
            lVar5 = 0;
            do {
              if (local_a8[lVar5] == node1) {
                local_a8[lVar5] = node0;
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 < ref_cell->node_per);
          }
          uVar4 = ref_node_tri_normal(ref_node,local_a8,&local_e8);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x2a4,"ref_collapse_edge_same_normal",(ulong)uVar4,"new normal");
            return uVar4;
          }
          uVar4 = ref_math_normalize(&local_e8);
          if (uVar4 == 4) {
LAB_001b1bed:
            *local_f8 = 0;
            return 0;
          }
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x2aa,"ref_collapse_edge_same_normal",(ulong)uVar4,"new normal length");
            return uVar4;
          }
          if (local_b8 * local_d8 + local_c8 * local_e8 + local_c0 * local_e0 <
              ref_node->same_normal_tol) goto LAB_001b1bed;
        }
      }
      pRVar3 = ref_cell->ref_adj->item;
      iVar1 = pRVar3[(int)uVar6].next;
      uVar6 = (ulong)iVar1;
      if (uVar6 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar3[uVar6].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_same_normal(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL n0[3], n1[3];
  REF_DBL dot;
  REF_STATUS status;
  REF_BOOL supported;

  *allowed = REF_TRUE;

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    /* a triangle with node0 and node1 will be removed */
    if (node0 == ref_cell_c2n(ref_cell, 0, cell) ||
        node0 == ref_cell_c2n(ref_cell, 1, cell) ||
        node0 == ref_cell_c2n(ref_cell, 2, cell))
      continue;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    RSS(ref_geom_tri_supported(ref_geom, nodes, &supported), "tri support");
    if (supported) continue; /* geom support, checked by normdev */

    RSS(ref_node_tri_normal(ref_node, nodes, n0), "orig normal");
    RSS(ref_math_normalize(n0), "original triangle has zero area");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) {
        nodes[node] = node0;
      }
    }
    RSS(ref_node_tri_normal(ref_node, nodes, n1), "new normal");
    status = ref_math_normalize(n1);
    if (REF_DIV_ZERO == status) { /* new triangle face has zero area */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(status, "new normal length")
    dot = ref_math_dot(n0, n1);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}